

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O3

void __thiscall LinkedReadsDatastore::load_index(LinkedReadsDatastore *this,string *_filename)

{
  pointer __ptr;
  _Alloc_hider __n;
  FILE *__stream;
  uint64_t uVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  runtime_error *prVar5;
  long *plVar6;
  size_type *psVar7;
  SDG_FILETYPE type;
  sdgVersion_t version;
  uint64_t s;
  sdgMagic_t magic;
  uint64_t sname;
  ushort local_cc;
  ushort local_ca;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  short local_a2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::_M_assign((string *)this);
  __stream = fopen((this->filename)._M_dataplus._M_p,"r");
  this->fd = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to open ",0xf);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->filename)._M_dataplus._M_p,
                        (this->filename)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c8,"Could not open ",&this->filename);
    std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fread(&local_a2,2,1,__stream);
  fread(&local_ca,2,1,(FILE *)this->fd);
  fread(&local_cc,2,1,(FILE *)this->fd);
  if (local_a2 != 0x5d6) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_c8,"Magic number not present in ",_filename);
    std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_ca < 3) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_60,(uint)local_ca);
    std::operator+(&local_80,"LinkedReadsDS file version: ",&local_60);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_80);
    local_a0._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_a0._M_dataplus._M_p == psVar7) {
      local_a0.field_2._M_allocated_capacity = *psVar7;
      local_a0.field_2._8_8_ = plVar6[3];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar7;
    }
    local_a0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::to_string(&local_40,3);
    std::operator+(&local_c8,&local_a0,&local_40);
    std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_cc == 3) {
    local_a0._M_dataplus._M_p = (pointer)0x0;
    fread(&local_a0,8,1,(FILE *)this->fd);
    __n._M_p = local_a0._M_dataplus._M_p;
    std::__cxx11::string::resize((ulong)&this->name,(char)local_a0._M_dataplus._M_p);
    fread((this->name)._M_dataplus._M_p,1,(size_t)__n._M_p,(FILE *)this->fd);
    fread(&this->readsize,8,1,(FILE *)this->fd);
    fread(&local_c8,8,1,(FILE *)this->fd);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->read_tag,(size_type)local_c8._M_dataplus._M_p);
    __ptr = (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start;
    fread(__ptr,4,(long)(this->read_tag).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)__ptr >> 2,(FILE *)this->fd);
    uVar1 = ftell((FILE *)this->fd);
    this->readpos_offset = uVar1;
    poVar2 = sdglib::OutputLog(INFO,true);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"LinkedReadsDatastore open: ",0x1b);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(_filename->_M_dataplus)._M_p,_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  max read length: ",0x13);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," Total reads: ",0xe);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_80,(uint)local_cc);
  std::operator+(&local_a0,"File type supplied: ",&local_80);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_a0);
  local_c8._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_c8._M_dataplus._M_p == psVar7) {
    local_c8.field_2._M_allocated_capacity = *psVar7;
    local_c8.field_2._8_8_ = plVar6[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar7;
  }
  local_c8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::runtime_error::runtime_error(prVar5,(string *)&local_c8);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void LinkedReadsDatastore::load_index(std::string _filename){
    uint64_t s;
    filename=_filename;
    fd=fopen(filename.c_str(),"r");
    if (!fd) {
        std::cerr << "Failed to open " << filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + filename);
    }
    sdgMagic_t magic;
    sdgVersion_t version;
    SDG_FILETYPE type;
    fread((char *) &magic, sizeof(magic),1,fd);
    fread((char *) &version, sizeof(version),1,fd);
    fread((char *) &type, sizeof(type),1,fd);

    if (magic != SDG_MAGIC) {
        throw std::runtime_error("Magic number not present in " + _filename);
    }

    if (version < min_compat) {
        throw std::runtime_error("LinkedReadsDS file version: " + std::to_string(version) + " is not compatible with " + std::to_string(min_compat));
    }

    if (type != LinkedDS_FT) {
        throw std::runtime_error("File type supplied: " + std::to_string(type) + " is not compatible with LinkedDS_FT");
    }

    uint64_t sname=0;
    fread( &sname, sizeof(sname), 1, fd);
    name.resize(sname);
    fread( (char *) name.data(), sizeof(char), sname, fd);

    fread( &readsize,sizeof(readsize),1,fd);
    fread(&s,sizeof(s),1,fd); read_tag.resize(s);
    fread(read_tag.data(),sizeof(read_tag[0]),read_tag.size(),fd);
    readpos_offset=ftell(fd);
    sdglib::OutputLog()<<"LinkedReadsDatastore open: "<<_filename<<"  max read length: "<<readsize<<" Total reads: " <<size()<<std::endl;
}